

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestDoubleToShortestSingle(void)

{
  bool bVar1;
  undefined1 in_CL;
  undefined1 uVar2;
  char *in_R8;
  char *in_R9;
  char buffer [128];
  StringBuilder local_1c0;
  DoubleToStringConverter local_1a8;
  DoubleToStringConverter local_178;
  DoubleToStringConverter local_148;
  DoubleToStringConverter local_118;
  DoubleToStringConverter local_e8;
  DoubleToStringConverter local_b8;
  char local_88 [128];
  char *pcVar3;
  
  local_1c0.buffer_.start_ = local_88;
  local_1c0.buffer_.length_ = 0x80;
  local_1c0.position_ = 0;
  local_1a8.flags_ = 9;
  local_1a8.infinity_symbol_ = (char *)0x0;
  local_1a8.nan_symbol_ = (char *)0x0;
  local_1a8.exponent_character_ = 'e';
  local_1a8.decimal_in_shortest_low_ = -6;
  local_1a8.decimal_in_shortest_high_ = 0x15;
  local_1a8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_1a8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1a8.min_exponent_width_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_1a8,0.0,&local_1c0);
  CheckHelper((char *)0x124,0xc0e75a,(char *)(ulong)bVar1,(bool)in_CL);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x125,0xc08053,"0",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_1a8,12345.0,&local_1c0);
  CheckHelper((char *)0x128,0xc0e77e,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x129,0xc0dc72,"12345",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_1a8,1.2345e+27,&local_1c0);
  CheckHelper((char *)0x12c,0xc0e7a6,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x12d,0xc0dc9c,"1.2345e+27",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_1a8,1e+21,&local_1c0);
  CheckHelper((char *)0x130,0xc0e7cf,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x131,0xc0dcd2,"1e+21",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_1a8,1e+20,&local_1c0);
  CheckHelper((char *)0x134,0xc0e7f4,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x135,0xc0dd25,"100000000000000000000",local_1c0.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_1a8,1.1111111e+20,&local_1c0);
  CheckHelper((char *)0x138,0xc0e819,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x139,0xc0e851,"111111110000000000000",local_1c0.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_1a8,1.11111114e+21,&local_1c0);
  CheckHelper((char *)0x13c,0xc0e87f,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x13d,0xc0e8b8,"1.11111114e+21",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_1a8,1.1111111e+22,&local_1c0);
  CheckHelper((char *)0x140,0xc0e8d8,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x141,0xc0e912,"1.1111111e+22",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_1a8,-1e-05,&local_1c0)
  ;
  CheckHelper((char *)0x144,0xc0e930,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x145,0xc0de55,"-0.00001",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_1a8,-1e-06,&local_1c0)
  ;
  CheckHelper((char *)0x148,0xc0e959,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x149,0xc0de8c,"-0.000001",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_1a8,-1e-07,&local_1c0)
  ;
  CheckHelper((char *)0x14c,0xc0e983,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x14d,0xc0dec6,"-1e-7",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_1a8,-0.0,&local_1c0);
  CheckHelper((char *)0x150,0xc0e9ae,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x151,0xc08053,"0",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_148.flags_ = 0;
  local_148.infinity_symbol_ = (char *)0x0;
  local_148.nan_symbol_ = (char *)0x0;
  local_148.exponent_character_ = 'e';
  local_148.decimal_in_shortest_low_ = -1;
  local_148.decimal_in_shortest_high_ = 1;
  local_148.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_148.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_148.min_exponent_width_ = 0;
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_148,0.1,&local_1c0);
  CheckHelper((char *)0x156,0xc0e9d3,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x157,0xc0e3a8,"0.1",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_148,0.01,&local_1c0);
  CheckHelper((char *)0x15a,0xc0e9f8,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x15b,0xc0e3cd,"1e-2",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_148,1.0,&local_1c0);
  CheckHelper((char *)0x15e,0xc0ea1e,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x15f,0xc080e3,"1",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_148,10.0,&local_1c0);
  CheckHelper((char *)0x162,0xc0ea43,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x163,0xc0e416,"1e1",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_148,-0.0,&local_1c0);
  CheckHelper((char *)0x166,0xc0ea69,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x167,0xc0e43f,"-0",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_b8.flags_ = 6;
  local_b8.infinity_symbol_ = (char *)0x0;
  local_b8.nan_symbol_ = (char *)0x0;
  local_b8.exponent_character_ = 'E';
  local_b8.decimal_in_shortest_low_ = -5;
  local_b8.decimal_in_shortest_high_ = 5;
  local_b8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_b8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_b8.min_exponent_width_ = 0;
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_b8,0.1,&local_1c0);
  CheckHelper((char *)0x16e,0xc0ea8f,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x16f,0xc0e3a8,"0.1",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_b8,1.0,&local_1c0);
  CheckHelper((char *)0x172,0xc0eab4,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x173,0xc0e480,"1.0",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_b8,10000.0,&local_1c0)
  ;
  CheckHelper((char *)0x176,0xc0ead9,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x177,0xc0e4a8,"10000.0",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_b8,100000.0,&local_1c0);
  CheckHelper((char *)0x17a,0xc0eb02,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x17b,0xc0e4dd,"1E5",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_178.flags_ = 1;
  local_178.infinity_symbol_ = (char *)0x0;
  local_178.nan_symbol_ = (char *)0x0;
  local_178.exponent_character_ = 'e';
  local_178.decimal_in_shortest_low_ = -6;
  local_178.decimal_in_shortest_high_ = 0x15;
  local_178.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_178.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_178.min_exponent_width_ = 0;
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_178,1e-06,&local_1c0);
  CheckHelper((char *)0x182,0xc0eb2c,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x183,0xc0e50a,"0.000001",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_178,1e-07,&local_1c0);
  CheckHelper((char *)0x186,0xc0eb56,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x187,0xc0e539,"1e-7",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_178,1.1111111e+20,&local_1c0);
  CheckHelper((char *)0x18a,0xc0eb81,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x18b,0xc0e851,"111111110000000000000",local_1c0.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_178,1e+20,&local_1c0);
  CheckHelper((char *)0x18e,0xc0ebba,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x18f,0xc0dd25,"100000000000000000000",local_1c0.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_178,1.11111114e+21,&local_1c0);
  CheckHelper((char *)0x192,0xc0ebf3,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x193,0xc0e8b8,"1.11111114e+21",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_e8.flags_ = 1;
  local_e8.infinity_symbol_ = (char *)0x0;
  local_e8.nan_symbol_ = (char *)0x0;
  local_e8.exponent_character_ = 'e';
  local_e8.min_exponent_width_ = 0;
  local_e8.decimal_in_shortest_low_ = 0;
  local_e8.decimal_in_shortest_high_ = 0;
  local_e8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_e8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_e8,INFINITY,&local_1c0);
  CheckHelper((char *)0x199,0xc0ec2d,(char *)(ulong)!bVar1,(bool)uVar2);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_e8,-INFINITY,&local_1c0);
  CheckHelper((char *)0x19c,0xc0ec61,(char *)(ulong)!bVar1,(bool)uVar2);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_e8,NAN,&local_1c0);
  CheckHelper((char *)0x19f,0xc0ec96,(char *)(ulong)!bVar1,(bool)uVar2);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_e8,-NAN,&local_1c0);
  CheckHelper((char *)0x1a2,0xc0ecc5,(char *)(ulong)!bVar1,(bool)uVar2);
  local_118.flags_ = 1;
  local_118.infinity_symbol_ = "Infinity";
  local_118.nan_symbol_ = "NaN";
  local_118.exponent_character_ = 'e';
  local_118.decimal_in_shortest_low_ = 0;
  local_118.decimal_in_shortest_high_ = 0;
  local_118.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_118.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_118.min_exponent_width_ = 0;
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_118,INFINITY,&local_1c0);
  CheckHelper((char *)0x1a7,0xc0ecf5,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x1a8,0xc0e6b4,"Infinity",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle
                    (&local_118,-INFINITY,&local_1c0);
  CheckHelper((char *)0x1ab,0xc0ed28,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x1ac,0xc0e6ed,"-Infinity",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_118,NAN,&local_1c0);
  CheckHelper((char *)0x1af,0xc0ed5c,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  pcVar3 = local_1c0.buffer_.start_;
  CheckEqualsHelper((char *)0x1b0,0xc0e72b,"NaN",local_1c0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1c0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestSingle(&local_118,-NAN,&local_1c0);
  CheckHelper((char *)0x1b3,0xc0ed8a,(char *)(ulong)bVar1,(bool)uVar2);
  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  local_1c0.position_ = -1;
  CheckEqualsHelper((char *)0x1b4,0xc0e72b,"NaN",local_1c0.buffer_.start_,in_R8,in_R9);
  if (-1 < (long)local_1c0.position_) {
    local_1c0.buffer_.start_[local_1c0.position_] = '\0';
  }
  return;
}

Assistant:

TEST(DoubleToShortestSingle) {
  const int kBufferSize = 128;
  char buffer[kBufferSize];
  StringBuilder builder(buffer, kBufferSize);
  int flags = DoubleToStringConverter::UNIQUE_ZERO |
      DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  CHECK(dc.ToShortestSingle(0.0f, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(12345.0f, &builder));
  CHECK_EQ("12345", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(12345e23f, &builder));
  CHECK_EQ("1.2345e+27", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(1e21f, &builder));
  CHECK_EQ("1e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(1e20f, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(111111111111111111111.0f, &builder));
  CHECK_EQ("111111110000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(1111111111111111111111.0f, &builder));
  CHECK_EQ("1.11111114e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(11111111111111111111111.0f, &builder));
  CHECK_EQ("1.1111111e+22", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(-0.00001f, &builder));
  CHECK_EQ("-0.00001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(-0.000001f, &builder));
  CHECK_EQ("-0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(-0.0000001f, &builder));
  CHECK_EQ("-1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(-0.0f, &builder));
  CHECK_EQ("0", builder.Finalize());

  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc2(flags, NULL, NULL, 'e', -1, 1, 0, 0);
  builder.Reset();
  CHECK(dc2.ToShortestSingle(0.1f, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortestSingle(0.01f, &builder));
  CHECK_EQ("1e-2", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortestSingle(1.0f, &builder));
  CHECK_EQ("1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortestSingle(10.0f, &builder));
  CHECK_EQ("1e1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortestSingle(-0.0f, &builder));
  CHECK_EQ("-0", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc3(flags, NULL, NULL, 'E', -5, 5, 0, 0);

  builder.Reset();
  CHECK(dc3.ToShortestSingle(0.1f, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortestSingle(1.0f, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortestSingle(10000.0f, &builder));
  CHECK_EQ("10000.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortestSingle(100000.0f, &builder));
  CHECK_EQ("1E5", builder.Finalize());

  // Test the examples in the comments of ToShortestSingle.
  flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc4(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  builder.Reset();
  CHECK(dc4.ToShortestSingle(0.000001f, &builder));
  CHECK_EQ("0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortestSingle(0.0000001f, &builder));
  CHECK_EQ("1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortestSingle(111111111111111111111.0f, &builder));
  CHECK_EQ("111111110000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortestSingle(100000000000000000000.0f, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortestSingle(1111111111111111111111.0f, &builder));
  CHECK_EQ("1.11111114e+21", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc5(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc5.ToShortestSingle(Single::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortestSingle(-Single::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortestSingle(Single::NaN(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortestSingle(-Single::NaN(), &builder));

  DoubleToStringConverter dc6(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc6.ToShortestSingle(Single::Infinity(), &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortestSingle(-Single::Infinity(), &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortestSingle(Single::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortestSingle(-Single::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());
}